

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O1

void do_free_pn_space(st_quicly_pn_space_t *space)

{
  quicly_range_t *pqVar1;
  quicly_range_t *__ptr;
  
  __ptr = (space->ack_queue).ranges;
  pqVar1 = &(space->ack_queue)._initial;
  if (__ptr != pqVar1) {
    free(__ptr);
    (space->ack_queue).ranges = pqVar1;
  }
  (space->ack_queue).num_ranges = 0;
  (space->ack_queue).capacity = 1;
  free(space);
  return;
}

Assistant:

static void do_free_pn_space(struct st_quicly_pn_space_t *space)
{
    quicly_ranges_clear(&space->ack_queue);
    free(space);
}